

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

_Bool array_container_is_subset(array_container_t *container1,array_container_t *container2)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  _Bool _Var6;
  
  iVar1 = container1->cardinality;
  uVar2 = container2->cardinality;
  _Var6 = false;
  iVar3 = 0;
  if (iVar1 <= (int)uVar2) {
    if (0 < (int)uVar2 && 0 < iVar1) {
      iVar3 = 0;
      uVar4 = 1;
      do {
        if (container1->array[iVar3] == container2->array[uVar4 - 1]) {
          iVar3 = iVar3 + 1;
        }
        else if (container1->array[iVar3] <= container2->array[uVar4 - 1]) {
          return false;
        }
      } while ((iVar3 < iVar1) && (bVar5 = uVar4 < uVar2, uVar4 = uVar4 + 1, bVar5));
    }
    _Var6 = iVar3 == iVar1;
  }
  return _Var6;
}

Assistant:

bool array_container_is_subset(const array_container_t *container1,
                               const array_container_t *container2) {
    if (container1->cardinality > container2->cardinality) {
        return false;
    }
    int i1 = 0, i2 = 0;
    while (i1 < container1->cardinality && i2 < container2->cardinality) {
        if (container1->array[i1] == container2->array[i2]) {
            i1++;
            i2++;
        } else if (container1->array[i1] > container2->array[i2]) {
            i2++;
        } else {  // container1->array[i1] < container2->array[i2]
            return false;
        }
    }
    if (i1 == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}